

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

SDL_bool PushEventIfNotFiltered(SDL12_Event *event12)

{
  SDL_bool in_EAX;
  int iVar1;
  SDL_bool SVar2;
  
  if (event12->type == '\0') {
    return in_EAX;
  }
  (*SDL20_LockMutex)(EventQueueMutex);
  if (EventStates[event12->type] != '\0') {
    if (EventFilter12 != (SDL12_EventFilter)0x0) {
      iVar1 = (*EventFilter12)(event12);
      if (iVar1 == 0) goto LAB_00114c42;
    }
    SDL_PushEvent(event12);
  }
LAB_00114c42:
  SVar2 = (*SDL20_UnlockMutex)(EventQueueMutex);
  return SVar2;
}

Assistant:

static SDL_bool
PushEventIfNotFiltered(SDL12_Event *event12)
{
    SDL_bool retval = SDL_FALSE;
    if (event12->type != SDL12_NOEVENT) {
        SDL_assert(EventQueueMutex != NULL);
        SDL20_LockMutex(EventQueueMutex);
        if (EventStates[event12->type] != SDL_IGNORE) {
            if ((!EventFilter12) || (EventFilter12(event12))) {
                retval = (SDL_PushEvent(event12) == 0)? SDL_TRUE : SDL_FALSE;
            }
        }
        SDL20_UnlockMutex(EventQueueMutex);
    }
    return retval;
}